

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void __thiscall
Test_Template_ExpandTemplate::Test_Template_ExpandTemplate(Test_Template_ExpandTemplate *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(Template, ExpandTemplate) {
  string filename = StringToTemplateFile("  hi {{THERE}}");
  TemplateDictionary dict("test_expand");
  dict.SetValue("THERE", "test");
  string output;
  ASSERT(ExpandTemplate(filename, STRIP_WHITESPACE, &dict, &output));
  ASSERT_STREQ(output.c_str(), "hi test");

  // This will append to output, so we see both together.
  ASSERT(ExpandWithData(filename, DO_NOT_STRIP, &dict, NULL, &output));
  ASSERT_STREQ(output.c_str(), "hi test  hi test");

  ASSERT(!ExpandTemplate(filename + " not found", DO_NOT_STRIP, &dict,
                         &output));
}